

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

int envy_bios_parse_power_unk3c(envy_bios *bios)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  envy_bios_power_unk3c_entry *peVar5;
  uint32_t uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  
  uVar7 = (bios->power).unk3c.offset;
  iVar10 = -0x16;
  if ((ulong)uVar7 != 0) {
    if (uVar7 < bios->length) {
      (bios->power).unk3c.version = bios->data[uVar7];
    }
    else {
      (bios->power).unk3c.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar1 = (bios->power).unk3c.version;
    if ((uVar1 == ' ') || (uVar1 == '\x10')) {
      uVar7 = (bios->power).unk3c.offset + 1;
      if (uVar7 < bios->length) {
        (bios->power).unk3c.hlen = bios->data[uVar7];
        iVar10 = 0;
      }
      else {
        (bios->power).unk3c.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar10 = -0xe;
      }
      uVar7 = (bios->power).unk3c.offset + 2;
      if (uVar7 < bios->length) {
        (bios->power).unk3c.rlen = bios->data[uVar7];
        iVar8 = 0;
      }
      else {
        (bios->power).unk3c.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar8 = -0xe;
      }
      uVar7 = (bios->power).unk3c.offset + 3;
      if (uVar7 < bios->length) {
        (bios->power).unk3c.entriesnum = bios->data[uVar7];
        iVar4 = 0;
      }
      else {
        (bios->power).unk3c.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar4 = -0xe;
      }
      (bios->power).unk3c.valid = (iVar8 == 0 && iVar10 == 0) && iVar4 == 0;
      bVar2 = (bios->power).unk3c.entriesnum;
      peVar5 = (envy_bios_power_unk3c_entry *)malloc((ulong)((uint)bVar2 * 4));
      (bios->power).unk3c.entries = peVar5;
      if (bVar2 == 0) {
        iVar10 = 0;
      }
      else {
        uVar6 = (uint)(bios->power).unk3c.hlen + (bios->power).unk3c.offset;
        bVar3 = (bios->power).unk3c.rlen;
        iVar10 = 0;
        uVar9 = 0;
        do {
          peVar5[uVar9].offset = uVar6;
          uVar9 = uVar9 + 1;
          uVar6 = uVar6 + bVar3;
        } while (bVar2 != uVar9);
      }
    }
    else {
      fprintf(_stderr,"Unknown POWER TOPOLOGY table version 0x%x\n");
    }
  }
  return iVar10;
}

Assistant:

int envy_bios_parse_power_unk3c(struct envy_bios *bios) {
	struct envy_bios_power_unk3c *unk3c = &bios->power.unk3c;
	int i, err = 0;

	if (!unk3c->offset)
		return -EINVAL;

	bios_u8(bios, unk3c->offset + 0x0, &unk3c->version);
	switch(unk3c->version) {
	case 0x10:
	case 0x20:
		err |= bios_u8(bios, unk3c->offset + 0x1, &unk3c->hlen);
		err |= bios_u8(bios, unk3c->offset + 0x2, &unk3c->rlen);
		err |= bios_u8(bios, unk3c->offset + 0x3, &unk3c->entriesnum);
		unk3c->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown POWER TOPOLOGY table version 0x%x\n", unk3c->version);
		return -EINVAL;
	};

	err = 0;
	unk3c->entries = malloc(unk3c->entriesnum * sizeof(struct envy_bios_power_unk3c_entry));
	for (i = 0; i < unk3c->entriesnum; i++) {
		uint32_t data = unk3c->offset + unk3c->hlen + i * unk3c->rlen;

		unk3c->entries[i].offset = data;
	}

	return 0;
}